

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_util.h
# Opt level: O2

string * getenv_string_abi_cxx11_(string *__return_storage_ptr__,char *name)

{
  char *pcVar1;
  allocator *paVar2;
  allocator local_a;
  allocator local_9;
  
  pcVar1 = getenv(name);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "";
    paVar2 = &local_9;
  }
  else {
    paVar2 = &local_a;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,paVar2);
  return __return_storage_ptr__;
}

Assistant:

inline std::string getenv_string ( const char* name){

    const char* env = nullptr;

#if defined(_WIN32)
    char buffer[1024];
    auto rc = GetEnvironmentVariable(name, buffer, 1024);
    if (0 != rc && rc <= 1024) {
        env = buffer;
    }
#else
    env = getenv(name);
#endif

    if ((nullptr == env))
        return "";
    return std::string(env);
}